

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void andres::marray_detail::
     stridesFromShape<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                begin,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      end,
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               strideBegin,CoordinateOrder *coordinateOrder)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (long)end._M_current - (long)begin._M_current >> 3;
  Assert<bool>((long)end._M_current - (long)begin._M_current != 0);
  if (*coordinateOrder == FirstMajorOrder) {
    strideBegin._M_current[uVar4 - 1] = 1;
    lVar2 = uVar4 * 8;
    uVar1 = 1;
    for (uVar3 = uVar1; uVar3 < uVar4; uVar3 = uVar3 + 1) {
      uVar1 = uVar1 * *(long *)((long)begin._M_current + lVar2 + -8);
      *(ulong *)((long)strideBegin._M_current + lVar2 + -0x10) = uVar1;
      lVar2 = lVar2 + -8;
    }
  }
  else {
    *strideBegin._M_current = 1;
    uVar1 = 1;
    for (uVar3 = uVar1; uVar3 < uVar4; uVar3 = uVar3 + 1) {
      uVar1 = uVar1 * begin._M_current[uVar3 - 1];
      strideBegin._M_current[uVar3] = uVar1;
    }
  }
  return;
}

Assistant:

inline void 
stridesFromShape
(
    ShapeIterator begin,
    ShapeIterator end,
    StridesIterator strideBegin,
    const CoordinateOrder& coordinateOrder
) 
{
    Assert(MARRAY_NO_ARG_TEST || std::distance(begin, end) != 0);
    std::size_t dimension = std::distance(begin, end);
    ShapeIterator shapeIt;
    StridesIterator strideIt;
    if(coordinateOrder == FirstMajorOrder) {
        shapeIt = begin + (dimension-1);
        strideIt = strideBegin + (dimension-1);
        *strideIt = 1;
        for(std::size_t j=1; j<dimension; ++j) {
            std::size_t tmp = *strideIt;
            --strideIt;
            (*strideIt) = tmp * (*shapeIt);
            --shapeIt;
        }
    }
    else {
        shapeIt = begin;
        strideIt = strideBegin;
        *strideIt = 1;
        for(std::size_t j=1; j<dimension; ++j) {
            std::size_t tmp = *strideIt;
            ++strideIt;
            (*strideIt) = tmp * (*shapeIt);
            ++shapeIt;
        }
    }
}